

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O2

int __thiscall
TadsHttpServerThread::read_to_nl
          (TadsHttpServerThread *this,StringRef *dst,long ofs,int init_state,int end_state)

{
  ssize_t l;
  uint uVar1;
  char buf [8192];
  
  while( true ) {
    while ((ofs < dst->len && (init_state != end_state))) {
      if (dst->str[ofs] == '\r') {
        init_state = (uint)(init_state == 2) * 2 + 1;
      }
      else {
        uVar1 = init_state & 0xfffffffd;
        init_state = init_state + 1;
        if (dst->str[ofs] != '\n') {
          init_state = 0;
        }
        if (uVar1 != 1) {
          init_state = 0;
        }
      }
      ofs = ofs + 1;
    }
    if (init_state == end_state) goto LAB_0020a6d3;
    l = TadsServerThread::read(&this->super_TadsServerThread,(int)buf,(void *)0x2000,1);
    TadsServerThread::set_run_state(&this->super_TadsServerThread,"Processing request");
    if (l < 0) break;
    StringRef::append(dst,buf,l);
  }
  ofs = -1;
LAB_0020a6d3:
  return (int)ofs;
}

Assistant:

int TadsHttpServerThread::read_to_nl(StringRef *dst, long ofs,
                                     int init_state, int end_state)
{
    /* newline state: 0 \r -> 1 \n -> 2 \r -> 3 \n -> 4 */
    int nlstate = init_state;

    /* keep going until we find the newline or newline pair */
    for (;;)
    {
        char buf[8192];

        /* scan up to the ending offset */
        const char *p = dst->get() + ofs;
        long endofs = dst->getlen();
        for ( ; ofs < endofs && nlstate != end_state ; ++ofs, ++p)
        {
            if (nlstate == 2 && *p == '\r')
                nlstate = 3;
            else if (*p == '\r')
                nlstate = 1;
            else if ((nlstate == 1 || nlstate == 3) && *p == '\n')
                nlstate += 1;
            else
                nlstate = 0;
        }

        /* if we're in the end state, we're done */
        if (nlstate == end_state)
            break;

        /* 
         *   We didn't find the end sequence, so we need more input.  Read at
         *   least one byte with no timeout, so that we block until
         *   something's available and then read all available bytes.  
         */
        long len = read(buf, sizeof(buf), 1, OS_FOREVER);
        set_run_state("Processing request");

        /* if we got the 'quit' signal, stop now */
        if (len < 0)
            return -1;

        /* append the text to the buffer */
        dst->append(buf, len);
    }

    /* return the buffer offset of the end of the terminating newline */
    return ofs;
}